

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O3

int __thiscall pele::physics::reactions::ReactorArkode::init(ReactorArkode *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int *ptr;
  int *ptr_00;
  ostringstream *this_00;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  string controller_string;
  string method_string;
  ParmParse pp;
  long *local_258;
  char *local_250;
  long local_248 [2];
  long *local_238;
  char *local_230;
  long local_228 [2];
  int *local_218;
  undefined1 local_210 [24];
  undefined8 auStack_1f8 [46];
  ParmParse local_88;
  
  this->m_reactor_type = (int)ctx;
  if (1 < (int)ctx - 1U) {
    amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
  }
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"ode","");
  amrex::ParmParse::ParmParse(&local_88,(string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  amrex::ParmParse::query
            (&local_88,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorArkode>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&local_88,"use_erkstep",&this->use_erkstep,0);
  amrex::ParmParse::query(&local_88,"rtol",&this->relTol,0);
  amrex::ParmParse::query(&local_88,"atol",&this->absTol,0);
  local_218 = &this->atomic_reductions;
  amrex::ParmParse::query(&local_88,"atomic_reductions",local_218,0);
  ptr = &this->rk_method;
  amrex::ParmParse::query(&local_88,"rk_method",ptr,0);
  ptr_00 = &this->rk_controller;
  amrex::ParmParse::query(&local_88,"rk_controller",ptr_00,0);
  amrex::ParmParse::query(&local_88,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  local_238 = local_228;
  pcVar3 = "ARKODE_ZONNEVELD_5_3_4";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"ARKODE_ZONNEVELD_5_3_4","");
  local_258 = local_248;
  pcVar4 = "PID";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"PID","");
  local_210._8_8_ = amrex::OutStream();
  this_00 = (ostringstream *)(local_210 + 0x10);
  local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
  local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
  std::__cxx11::ostringstream::ostringstream(this_00);
  *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
       *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Initializing ARKODE:\n",0x15);
  amrex::Print::~Print((Print *)local_210);
  iVar2 = *ptr;
  if (iVar2 < 0x3c) {
    switch(iVar2) {
    case 0x1e:
      pcVar3 = "ARKODE_BOGACKI_SHAMPINE_4_2_3";
      iVar2 = 1;
      break;
    case 0x1f:
      pcVar3 = "ARKODE_ARK324L2SA_ERK_4_2_3";
      iVar2 = 2;
      break;
    case 0x29:
      pcVar3 = "ARKODE_ARK436L2SA_ERK_6_3_4";
      iVar2 = 4;
      break;
    case 0x2a:
      pcVar3 = "ARKODE_SAYFY_ABURUB_6_3_4";
      iVar2 = 5;
      break;
    case 0x2b:
      pcVar3 = "ARKODE_ARK437L2SA_ERK_7_3_4";
      iVar2 = 0xd;
      break;
    case 0x32:
      pcVar3 = "ARKODE_CASH_KARP_6_4_5";
      iVar2 = 6;
      break;
    case 0x33:
      pcVar3 = "ARKODE_FEHLBERG_6_4_5";
      iVar2 = 7;
      break;
    case 0x34:
      pcVar3 = "ARKODE_DORMAND_PRINCE_7_4_5";
      iVar2 = 8;
      break;
    case 0x35:
      pcVar3 = "ARKODE_ARK548L2SA_ERK_8_4_5";
      iVar2 = 9;
      break;
    case 0x36:
      pcVar3 = "ARKODE_ARK548L2SAb_ERK_8_4_5";
      iVar2 = 0xe;
      break;
    default:
      if (iVar2 == 0x14) {
        pcVar3 = "ARKODE_HEUN_EULER_2_1_2";
        iVar2 = 0;
        break;
      }
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
switchD_001a0312_caseD_20:
      iVar2 = 3;
    }
LAB_001a0448:
    *ptr = iVar2;
    std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,(ulong)pcVar3);
    uVar1 = *ptr_00 - 1;
    iVar2 = 0;
    if (uVar1 < 3) {
      pcVar4 = &DAT_00751480 + *(int *)(&DAT_00751480 + (ulong)uVar1 * 4);
      iVar2 = *ptr_00;
    }
    *ptr_00 = iVar2;
    std::__cxx11::string::_M_replace((ulong)&local_258,0,local_250,(ulong)pcVar4);
    if (this->use_erkstep == 1) {
      local_210._8_8_ = amrex::OutStream();
      local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
           *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Using ERKStep",0xf);
      std::ios::widen((char)*(undefined8 *)(local_210._16_8_ - 0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    else {
      local_210._8_8_ = amrex::OutStream();
      local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
           *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Using ARKStep",0xf);
      std::ios::widen((char)*(undefined8 *)(local_210._16_8_ - 0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    amrex::Print::~Print((Print *)local_210);
    local_210._8_8_ = amrex::OutStream();
    local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Using ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)local_238,(long)local_230);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," method",7);
    std::ios::widen((char)*(undefined8 *)(local_210._16_8_ - 0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    amrex::Print::~Print((Print *)local_210);
    local_210._8_8_ = amrex::OutStream();
    local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Using the ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)local_258,(long)local_250);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," controller",0xb);
    std::ios::widen((char)*(undefined8 *)(local_210._16_8_ - 0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    amrex::Print::~Print((Print *)local_210);
    if (*local_218 == 0) {
      local_210._8_8_ = amrex::OutStream();
      local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
      *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
           *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_210 + 0x10),"  Using LDS reductions\n",0x17);
    }
    else {
      local_210._8_8_ = amrex::OutStream();
      local_210._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_210._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
      *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
           *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_210 + 0x10),"  Using atomic reductions\n",0x1a);
    }
    amrex::Print::~Print((Print *)local_210);
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88);
    return 0;
  }
  if (iVar2 == 0x3c) {
    pcVar3 = "ARKODE_VERNER_8_5_6";
    iVar2 = 10;
    goto LAB_001a0448;
  }
  if (iVar2 == 0x50) {
    pcVar3 = "ARKODE_FEHLBERG_13_7_8";
    iVar2 = 0xb;
    goto LAB_001a0448;
  }
  goto switchD_001a0312_caseD_20;
}

Assistant:

int
ReactorArkode::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorArkode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("use_erkstep", use_erkstep);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("rk_method", rk_method);
  pp.query("rk_controller", rk_controller);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  std::string method_string = "ARKODE_ZONNEVELD_5_3_4";
  std::string controller_string = "PID";

  amrex::Print() << "Initializing ARKODE:\n";

  switch (rk_method) {
  case 20:
    rk_method = ARKODE_HEUN_EULER_2_1_2;
    method_string = "ARKODE_HEUN_EULER_2_1_2";
    break;
  case 30:
    rk_method = ARKODE_BOGACKI_SHAMPINE_4_2_3;
    method_string = "ARKODE_BOGACKI_SHAMPINE_4_2_3";
    break;
  case 31:
    rk_method = ARKODE_ARK324L2SA_ERK_4_2_3;
    method_string = "ARKODE_ARK324L2SA_ERK_4_2_3";
    break;
  case 40:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  case 41:
    rk_method = ARKODE_ARK436L2SA_ERK_6_3_4;
    method_string = "ARKODE_ARK436L2SA_ERK_6_3_4";
    break;
  case 42:
    rk_method = ARKODE_SAYFY_ABURUB_6_3_4;
    method_string = "ARKODE_SAYFY_ABURUB_6_3_4";
    break;
  case 43:
    rk_method = ARKODE_ARK437L2SA_ERK_7_3_4;
    method_string = "ARKODE_ARK437L2SA_ERK_7_3_4";
    break;
  case 50:
    rk_method = ARKODE_CASH_KARP_6_4_5;
    method_string = "ARKODE_CASH_KARP_6_4_5";
    break;
  case 51:
    rk_method = ARKODE_FEHLBERG_6_4_5;
    method_string = "ARKODE_FEHLBERG_6_4_5";
    break;
  case 52:
    rk_method = ARKODE_DORMAND_PRINCE_7_4_5;
    method_string = "ARKODE_DORMAND_PRINCE_7_4_5";
    break;
  case 53:
    rk_method = ARKODE_ARK548L2SA_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SA_ERK_8_4_5";
    break;
  case 54:
    rk_method = ARKODE_ARK548L2SAb_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SAb_ERK_8_4_5";
    break;
  case 60:
    rk_method = ARKODE_VERNER_8_5_6;
    method_string = "ARKODE_VERNER_8_5_6";
    break;
  case 80:
    rk_method = ARKODE_FEHLBERG_13_7_8;
    method_string = "ARKODE_FEHLBERG_13_7_8";
    break;
  default:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  }

  switch (rk_controller) {
  case 0:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  case 1:
    rk_controller = ARK_ADAPT_PI;
    controller_string = "PI";
    break;
  case 2:
    rk_controller = ARK_ADAPT_I;
    controller_string = "I";
    break;
  case 3:
    rk_controller = ARK_ADAPT_EXP_GUS;
    controller_string = "explicit Gustafsson";
    break;
  default:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  }

  if (use_erkstep == 1) {
    amrex::Print() << "  Using ERKStep" << std::endl;
  } else {
    amrex::Print() << "  Using ARKStep" << std::endl;
  }
  amrex::Print() << "  Using " << method_string << " method" << std::endl;
  amrex::Print() << "  Using the " << controller_string << " controller"
                 << std::endl;

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

  return (0);
}